

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

sysbvm_tuple_t sysbvm_tuple_slotAt(sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = (tuple & 0xf) == 0;
  if (bVar2 && tuple != 0) {
    if ((*(byte *)(tuple + 8) & 0x80) != 0) {
      sysbvm_error_accessDummyValue();
    }
    if (bVar2 && tuple != 0) {
      if ((*(uint *)(tuple + 8) & 0x300) != 0x200) {
        if (slotIndex < *(uint *)(tuple + 0xc) >> 3) {
          return *(sysbvm_tuple_t *)(tuple + 0x10 + slotIndex * 8);
        }
LAB_00143ab9:
        sysbvm_error_outOfBoundsSlotAccess();
        return 0;
      }
      if (*(uint *)(tuple + 0xc) <= slotIndex) goto LAB_00143ab9;
      uVar1 = (uint)*(byte *)(tuple + 0x10 + slotIndex);
      goto LAB_00143a9d;
    }
  }
  if (7 < slotIndex) {
    return 0;
  }
  uVar1 = (uint)((long)tuple >> ((byte)((int)slotIndex << 3) & 0x3f | 4)) & 0xff;
LAB_00143a9d:
  return (ulong)(uVar1 << 4) | 3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_slotAt(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex)
{
    (void)context;
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();

    if(!sysbvm_tuple_isNonNullPointer(tuple))
    {
        if(slotIndex < sizeof(sysbvm_tuple_t))
        {
            sysbvm_tuple_t byteValue = ( ((sysbvm_stuple_t)tuple) >> (SYSBVM_TUPLE_TAG_BIT_COUNT + slotIndex*8)) & 0xFF;
            return sysbvm_tuple_uint8_encode((uint8_t)byteValue);
        }

        return SYSBVM_NULL_TUPLE;
    }

    if(sysbvm_tuple_isBytes(tuple))
    {
        if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
            return sysbvm_tuple_uint8_encode(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex]);
    }
    else
    {
        if(slotIndex < sysbvm_tuple_getSizeInSlots(tuple))
            return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->pointers[slotIndex];
    }

    sysbvm_error_outOfBoundsSlotAccess();
    return SYSBVM_NULL_TUPLE;
}